

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
::swap(btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
       *this,btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
             *x,allocator_type *alloc)

{
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *x_00;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  **ppbVar5;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  **ppbVar6;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  **ppbVar7;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *pbVar8;
  long lVar9;
  char *__function;
  uint i;
  ulong i_00;
  ulong uVar10;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *this_00;
  
  if ((((ulong)this & 7) == 0) && (((ulong)x & 7) == 0)) {
    if ((this[0xb] !=
        (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
         )0x0) != (x[0xb] !=
                  (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                   )0x0)) {
      __assert_fail("leaf() == x->leaf()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x6bc,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>]"
                   );
    }
    this_00 = x;
    x_00 = this;
    if ((byte)x[10] < (byte)this[10]) {
      this_00 = this;
      x_00 = x;
    }
    bVar1 = x_00[10];
    if (bVar1 != (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                  )0x0) {
      lVar9 = 0x10;
      do {
        pbVar8 = x_00 + lVar9;
        uVar2 = *(undefined8 *)pbVar8;
        *(undefined8 *)pbVar8 = *(undefined8 *)(this_00 + lVar9);
        *(undefined8 *)(this_00 + lVar9) = uVar2;
        uVar3 = *(undefined8 *)(pbVar8 + 8);
        uVar4 = *(undefined8 *)(pbVar8 + 0x10);
        uVar2 = *(undefined8 *)(pbVar8 + 0x18);
        *(undefined8 *)(pbVar8 + 8) = *(undefined8 *)(this_00 + lVar9 + 8);
        *(undefined8 *)(pbVar8 + 0x10) = *(undefined8 *)(this_00 + lVar9 + 0x10);
        *(undefined8 *)(pbVar8 + 0x18) = *(undefined8 *)(this_00 + lVar9 + 0x18);
        *(undefined8 *)(this_00 + lVar9 + 8) = uVar3;
        *(undefined8 *)(this_00 + lVar9 + 8 + 8) = uVar4;
        *(undefined8 *)(this_00 + lVar9 + 0x18) = uVar2;
        lVar9 = lVar9 + 0x20;
      } while (pbVar8 + 0x20 != x_00 + (ulong)(byte)bVar1 * 0x20 + 0x10);
    }
    uVar10 = (ulong)(byte)this_00[10];
    i_00 = (ulong)(byte)x_00[10];
    uninitialized_move_n(this_00,uVar10 - i_00,i_00,i_00,x_00,alloc);
    lVar9 = uVar10 - i_00;
    if (lVar9 != 0 && i_00 <= uVar10) {
      uVar10 = (ulong)(byte)x_00[10];
      do {
        value_destroy(this_00,uVar10,alloc);
        uVar10 = uVar10 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    if (this[0xb] ==
        (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
         )0x0) {
      ppbVar5 = mutable_child(x_00,0);
      ppbVar6 = mutable_child(x_00,(byte)x_00[10] + 1);
      ppbVar7 = mutable_child(this_00,0);
      for (; ppbVar5 != ppbVar6; ppbVar5 = ppbVar5 + 1) {
        pbVar8 = *ppbVar5;
        *ppbVar5 = *ppbVar7;
        *ppbVar7 = pbVar8;
        ppbVar7 = ppbVar7 + 1;
      }
      i = 0xffffffff;
      do {
        i = i + 1;
        pbVar8 = child(x_00,i);
        if (((ulong)pbVar8 & 7) != 0) {
LAB_00227b96:
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = char]"
          ;
          goto LAB_00227bab;
        }
        *(btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
          **)pbVar8 = x_00;
        pbVar8 = child(this_00,i);
        if (((ulong)pbVar8 & 7) != 0) goto LAB_00227b96;
        *(btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
          **)pbVar8 = this_00;
      } while (i < (byte)x_00[10]);
      while (i < (byte)this_00[10]) {
        i = i + 1;
        pbVar8 = child(this_00,i);
        init_child(x_00,i,pbVar8);
        mutable_child(this_00,i);
      }
    }
    bVar1 = this[10];
    this[10] = x[10];
    x[10] = bVar1;
    return;
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2Shape *, std::vector<S2Shape *>>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape *, std::vector<S2Shape *>, std::less<S2Shape *>, std::allocator<std::pair<S2Shape *const, std::vector<S2Shape *>>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_00227bab:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
  using std::swap;
  assert(leaf() == x->leaf());

  // Determine which is the smaller/larger node.
  btree_node *smaller = this, *larger = x;
  if (smaller->count() > larger->count()) {
    swap(smaller, larger);
  }

  // Swap the values.
  for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
       a != end; ++a, ++b) {
    slot_type::swap(alloc, a, b);
  }

  // Move values that can't be swapped.
  const size_type to_move = larger->count() - smaller->count();
  larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                               smaller, alloc);
  larger->value_destroy_n(smaller->count(), to_move, alloc);

  if (!leaf()) {
    // Swap the child pointers.
    std::swap_ranges(&smaller->mutable_child(0),
                     &smaller->mutable_child(smaller->count() + 1),
                     &larger->mutable_child(0));
    // Update swapped children's parent pointers.
    int i = 0;
    for (; i <= smaller->count(); ++i) {
      smaller->child(i)->set_parent(smaller);
      larger->child(i)->set_parent(larger);
    }
    // Move the child pointers that couldn't be swapped.
    for (; i <= larger->count(); ++i) {
      smaller->init_child(i, larger->child(i));
      larger->clear_child(i);
    }
  }

  // Swap the counts.
  swap(mutable_count(), x->mutable_count());
}